

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O1

void * thread_monitor(void *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = *p;
  skynet_initthread(4);
  do {
    iVar2 = skynet_context_total();
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        skynet_monitor_check(*(skynet_monitor **)(*(long *)((long)p + 8) + uVar4 * 8));
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    iVar2 = 5;
    do {
      iVar3 = skynet_context_total();
      if (iVar3 == 0) break;
      sleep(1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  } while( true );
}

Assistant:

static void *
thread_monitor(void *p) {
	struct monitor * m = p;
	int i;
	int n = m->count;
	skynet_initthread(THREAD_MONITOR);
	for (;;) {
		CHECK_ABORT
		for (i=0;i<n;i++) {
			skynet_monitor_check(m->m[i]);
		}
		for (i=0;i<5;i++) {
			CHECK_ABORT
			sleep(1);
		}
	}

	return NULL;
}